

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Totals * __thiscall Catch::Runner::runTests(Totals *__return_storage_ptr__,Runner *this)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  size_t sVar4;
  int iVar5;
  size_t groupIndex;
  long lVar6;
  vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> filterGroups;
  RunContext context;
  string local_2c0;
  vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> local_2a0;
  undefined1 local_288 [48];
  vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_> local_258;
  _Alloc_hider local_240;
  char local_230 [280];
  Ptr<const_Catch::IConfig> local_118;
  size_t local_108;
  
  std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::vector
            (&local_2a0,&((this->m_config).m_p)->m_filterSets);
  if (local_2a0.super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_2a0.super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"");
    TestCaseFilters::TestCaseFilters((TestCaseFilters *)local_288,&local_2c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p);
    }
    std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::push_back
              (&local_2a0,(value_type *)local_288);
    if (local_240._M_p != local_230) {
      operator_delete(local_240._M_p);
    }
    std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::~vector(&local_258);
    std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::~vector
              ((vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_> *)
               (local_288 + 0x18));
    std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>::~vector
              ((vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_> *)local_288);
  }
  local_2c0._M_dataplus._M_p = (pointer)(this->m_config).m_p;
  if ((Config *)local_2c0._M_dataplus._M_p != (Config *)0x0) {
    (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&((Config *)local_2c0._M_dataplus._M_p)->super_SharedImpl<Catch::IConfig>)->
                 _M_allocated_capacity + 0x10))();
  }
  RunContext::RunContext
            ((RunContext *)local_288,(Ptr<const_Catch::IConfig> *)&local_2c0,&this->m_reporter);
  if ((Config *)local_2c0._M_dataplus._M_p != (Config *)0x0) {
    (**(code **)(*(size_type *)local_2c0._M_dataplus._M_p + 0x18))();
  }
  (__return_storage_ptr__->testCases).passed = 0;
  (__return_storage_ptr__->testCases).failed = 0;
  (__return_storage_ptr__->assertions).passed = 0;
  (__return_storage_ptr__->assertions).failed = 0;
  if (local_2a0.super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_2a0.super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar6 = 0;
    groupIndex = 0;
    do {
      sVar4 = local_108;
      iVar5 = (*((local_118.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[10])();
      if (sVar4 == (long)iVar5) break;
      paVar2 = &local_2c0.field_2;
      lVar3 = *(long *)((long)&((local_2a0.
                                 super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_name)._M_dataplus.
                               _M_p + lVar6);
      local_2c0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2c0,lVar3,
                 *(long *)((long)&((local_2a0.
                                    super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_name).
                                  _M_string_length + lVar6) + lVar3);
      RunContext::testGroupStarting
                ((RunContext *)local_288,&local_2c0,groupIndex,
                 ((long)local_2a0.
                        super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_2a0.
                        super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != paVar2) {
        operator_delete(local_2c0._M_dataplus._M_p);
      }
      runTestsForGroup((Totals *)&local_2c0,this,(RunContext *)local_288,
                       (TestCaseFilters *)
                       ((long)&((local_2a0.
                                 super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_tagExpressions).
                               super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar6));
      (__return_storage_ptr__->assertions).passed =
           (size_t)(local_2c0._M_dataplus._M_p + (__return_storage_ptr__->assertions).passed);
      psVar1 = &(__return_storage_ptr__->assertions).failed;
      *psVar1 = *psVar1 + local_2c0._M_string_length;
      (__return_storage_ptr__->testCases).passed =
           (__return_storage_ptr__->testCases).passed + local_2c0.field_2._M_allocated_capacity;
      psVar1 = &(__return_storage_ptr__->testCases).failed;
      *psVar1 = *psVar1 + local_2c0.field_2._8_8_;
      lVar3 = *(long *)((long)&((local_2a0.
                                 super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_name)._M_dataplus.
                               _M_p + lVar6);
      local_2c0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2c0,lVar3,
                 *(long *)((long)&((local_2a0.
                                    super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_name).
                                  _M_string_length + lVar6) + lVar3);
      RunContext::testGroupEnded
                ((RunContext *)local_288,&local_2c0,__return_storage_ptr__,groupIndex,
                 ((long)local_2a0.
                        super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_2a0.
                        super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != paVar2) {
        operator_delete(local_2c0._M_dataplus._M_p);
      }
      groupIndex = groupIndex + 1;
      lVar6 = lVar6 + 0x68;
    } while (groupIndex <
             (ulong)(((long)local_2a0.
                            super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_2a0.
                            super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5));
  }
  RunContext::~RunContext((RunContext *)local_288);
  std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::~vector(&local_2a0);
  return __return_storage_ptr__;
}

Assistant:

Totals runTests() {

            std::vector<TestCaseFilters> filterGroups = m_config->filters();
            if( filterGroups.empty() ) {
                TestCaseFilters filterGroup( "" );
                filterGroups.push_back( filterGroup );
            }

            RunContext context( m_config.get(), m_reporter );

            Totals totals;

            for( std::size_t i=0; i < filterGroups.size() && !context.aborting(); ++i ) {
                context.testGroupStarting( filterGroups[i].getName(), i, filterGroups.size() );
                totals += runTestsForGroup( context, filterGroups[i] );
                context.testGroupEnded( filterGroups[i].getName(), totals, i, filterGroups.size() );
            }
            return totals;
        }